

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_Nan_Test::iu_SyntaxTest_x_iutest_x_Nan_Test
          (iu_SyntaxTest_x_iutest_x_Nan_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Nan_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_Nan_Test_0061bb90;
  return;
}

Assistant:

IUTEST(SyntaxTest, Nan)
{
    float  fnan = ::std::numeric_limits<float>::quiet_NaN();
    double dnan = ::std::numeric_limits<double>::quiet_NaN();
    if( fnan )
        IUTEST_ASSERT_NAN(fnan) << fnan;
    if( fnan )
        IUTEST_EXPECT_NAN(fnan) << fnan;
    if( dnan )
        IUTEST_INFORM_NAN(dnan) << dnan;
    if( dnan )
        IUTEST_ASSUME_NAN(dnan) << dnan;
}